

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkPointTriface.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChLinkPointTrifaceRot::IntLoadConstraint_C
          (ChLinkPointTrifaceRot *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  double dVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  Scalar *pSVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  ChVector<double> result;
  undefined1 local_68 [16];
  double local_58;
  undefined1 local_48 [16];
  double local_38;
  
  iVar9 = (*(this->super_ChLinkBase).super_ChPhysicsItem.super_ChObj._vptr_ChObj[9])();
  if ((char)iVar9 != '\0') {
    peVar2 = (this->mtriangle).mnodeB1.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3 = (this->mtriangle).mnodeB2.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar4 = (this->mtriangle).mnodeB3.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    dVar1 = *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = dVar1;
    auVar26._8_8_ = *(undefined8 *)&peVar2->field_0x30;
    auVar26._0_8_ = *(undefined8 *)&peVar2->field_0x30;
    auVar16 = vsubpd_avx(*(undefined1 (*) [16])&peVar3->field_0x28,
                         *(undefined1 (*) [16])&peVar2->field_0x28);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = *(ulong *)&peVar4->field_0x30;
    auVar13 = vunpcklpd_avx(auVar26,auVar11);
    auVar11 = vmovhpd_avx(auVar24,*(undefined8 *)&(peVar4->super_ChNodeFEAbase).field_0x20);
    auVar13 = vsubpd_avx(auVar11,auVar13);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20 - dVar1;
    auVar11 = vshufpd_avx(auVar16,auVar12,1);
    auVar20._8_8_ = 0;
    auVar20._0_8_ =
         *(double *)&peVar4->field_0x28 - SUB168(*(undefined1 (*) [16])&peVar2->field_0x28,0);
    auVar15 = vunpcklpd_avx(auVar20,auVar13);
    auVar25._0_8_ = auVar15._0_8_ * auVar11._0_8_;
    auVar25._8_8_ = auVar15._8_8_ * auVar11._8_8_;
    local_48 = vfmsub231pd_fma(auVar25,auVar16,auVar13);
    auVar11 = vshufpd_avx(auVar13,auVar13,1);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = auVar11._0_8_ * auVar16._0_8_;
    auVar11 = vfmsub231sd_fma(auVar15,auVar12,auVar20);
    local_38 = auVar11._0_8_;
    ChVector<double>::Normalize((ChVector<double> *)local_48);
    dVar1 = this->s2;
    peVar2 = (this->mtriangle).mnodeB1.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar5 = (this->mnodeA).
             super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar3 = (this->mtriangle).mnodeB2.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar4 = (this->mtriangle).mnodeB3.
             super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    auVar13._0_8_ = dVar1 * *(double *)&peVar3->field_0x28;
    auVar13._8_8_ = dVar1 * *(double *)&peVar3->field_0x30;
    dVar6 = (1.0 - dVar1) - this->s3;
    auVar16._0_8_ = dVar6 * *(double *)&peVar2->field_0x28;
    auVar16._8_8_ = dVar6 * *(double *)&peVar2->field_0x30;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = *(ulong *)&(peVar4->super_ChNodeFEAbase).field_0x20;
    auVar11 = vmovhpd_avx(auVar22,local_48._0_8_);
    auVar23._0_8_ = this->s3 * auVar11._0_8_;
    auVar23._8_8_ = this->d * auVar11._8_8_;
    auVar11 = vshufpd_avx(auVar23,auVar23,1);
    auVar16 = vsubpd_avx(*(undefined1 (*) [16])&peVar5->field_0x28,auVar16);
    auVar16 = vsubpd_avx(auVar16,auVar13);
    auVar17._0_8_ = this->s3 * *(double *)&peVar4->field_0x28;
    auVar17._8_8_ = this->s3 * *(double *)&peVar4->field_0x30;
    auVar16 = vsubpd_avx(auVar16,auVar17);
    auVar18._0_8_ = this->d * (double)local_48._8_8_;
    auVar18._8_8_ = this->d * local_38;
    auVar16 = vsubpd_avx(auVar16,auVar18);
    local_58 = ((((*(double *)&(peVar5->super_ChNodeFEAbase).field_0x20 -
                  dVar6 * *(double *)&(peVar2->super_ChNodeFEAbase).field_0x20) -
                 dVar1 * *(double *)&(peVar3->super_ChNodeFEAbase).field_0x20) - auVar23._0_8_) -
               auVar11._0_8_) * c;
    local_68._0_8_ = auVar16._0_8_ * c;
    local_68._8_8_ = auVar16._8_8_ * c;
    if (do_clamp) {
      auVar8._8_8_ = in_XMM1_Qb;
      auVar8._0_8_ = recovery_clamp;
      auVar14._8_8_ = recovery_clamp;
      auVar14._0_8_ = recovery_clamp;
      auVar7._8_8_ = 0x8000000000000000;
      auVar7._0_8_ = 0x8000000000000000;
      auVar11 = vxorpd_avx512vl(auVar14,auVar7);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_58;
      auVar16 = vmaxsd_avx(auVar21,auVar11);
      auVar19._0_8_ = auVar11._0_8_;
      auVar19._8_8_ = auVar19._0_8_;
      auVar11 = vmaxpd_avx(local_68,auVar19);
      auVar16 = vminsd_avx(auVar16,auVar8);
      local_58 = auVar16._0_8_;
      local_68 = vminpd_avx(auVar11,auVar14);
    }
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                         (ulong)off_L);
    *pSVar10 = local_58 + *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                         (ulong)(off_L + 1));
    *pSVar10 = (double)local_68._0_8_ + *pSVar10;
    pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,
                         (ulong)(off_L + 2));
    auVar11 = vpermilpd_avx(local_68,1);
    *pSVar10 = auVar11._0_8_ + *pSVar10;
  }
  return;
}

Assistant:

void ChLinkPointTrifaceRot::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                                ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                                const double c,            // a scaling factor
                                                bool do_clamp,             // apply clamping to c*C?
                                                double recovery_clamp      // value for min/max clamping of c*C
) {
    if (!IsActive())
        return;

    // Compute residual of constraint as distance of two points: one is A,
    // other is on triangle at the s2,s3 area coordinates:
    //  C = A - s1*B1 - s2*B2 - s3*B3
    // If an offset d is desired, along normal N, this becomes:
    //  C = A - s1*B1 - s2*B2 - s3*B3 - d*N

    ChVector<> N = Vcross(mtriangle.mnodeB2->coord.pos - mtriangle.mnodeB1->coord.pos,
                          mtriangle.mnodeB3->coord.pos - mtriangle.mnodeB1->coord.pos);
    N.Normalize();
    double s1 = 1 - s2 - s3;

    ChVector<> res = mnodeA->GetPos() - s1 * mtriangle.mnodeB1->coord.pos - s2 * mtriangle.mnodeB2->coord.pos -
                     s3 * mtriangle.mnodeB3->coord.pos - N * d;

    ChVector<> cres = res * c;

    if (do_clamp) {
        cres.x() = ChMin(ChMax(cres.x(), -recovery_clamp), recovery_clamp);
        cres.y() = ChMin(ChMax(cres.y(), -recovery_clamp), recovery_clamp);
        cres.z() = ChMin(ChMax(cres.z(), -recovery_clamp), recovery_clamp);
    }
    Qc(off_L + 0) += cres.x();
    Qc(off_L + 1) += cres.y();
    Qc(off_L + 2) += cres.z();
}